

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

void GC::CheckFunction(char *ptr)

{
  ExternFuncInfo *pEVar1;
  ExternFuncInfo *func;
  NULLCFuncPtr *fPtr;
  char *ptr_local;
  
  if (((*(long *)ptr != 0) &&
      (pEVar1 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                          ((FastVector<ExternFuncInfo,_false,_false> *)(NULLC::commonLinker + 0x240)
                           ,*(uint *)(ptr + 8)), pEVar1->regVmAddress != -1)) &&
     (pEVar1->contextType != 0xffffffff)) {
    CheckPointer(ptr);
  }
  return;
}

Assistant:

void CheckFunction(char* ptr)
	{
		NULLCFuncPtr *fPtr = (NULLCFuncPtr*)ptr;

		// If there's no context, there's nothing to check
		if(!fPtr->context)
			return;

		const ExternFuncInfo &func = NULLC::commonLinker->exFunctions[fPtr->id];

		// External functions shouldn't be checked
		if(func.regVmAddress == -1)
			return;

		// If context is "this" pointer
		if(func.contextType != ~0u)
			CheckPointer((char*)&fPtr->context);
	}